

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O1

void __thiscall diy::AMRLink::Description::Description(Description *this)

{
  allocator<int> local_19;
  
  this->level = -1;
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
            (&(this->refinement).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>,1,&local_19
            );
  *(this->refinement).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin = 0;
  Bounds<int>::Bounds(&this->core,0);
  Bounds<int>::Bounds(&this->bounds,0);
  return;
}

Assistant:

Description() = default;